

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_bool>
pdqsort_detail::
partition_right<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::less<double>>
          (double *param_1,double *param_2)

{
  bool bVar1;
  reference pdVar2;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *p_Var3;
  pair<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_bool>
  pVar4;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> pivot_pos;
  bool already_partitioned;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first;
  T pivot;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff68;
  bool *__y;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff70;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *__x;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff78;
  byte local_79;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_68;
  double *local_60;
  double *local_58;
  undefined1 local_49;
  double *local_48;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_40;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_38;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *local_30;
  less<double> local_21;
  double *local_20;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_18 [3];
  
  local_20 = param_2;
  local_18[0]._M_current = param_1;
  pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator*(local_18);
  local_30 = (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)*pdVar2;
  local_38._M_current = local_18[0]._M_current;
  local_40._M_current = local_20;
  do {
    p_Var3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator++(&local_38);
    pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(p_Var3);
    bVar1 = std::less<double>::operator()(&local_21,pdVar2,(double *)&local_30);
  } while (bVar1);
  local_48 = (double *)
             __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator-(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70._M_current);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                     in_stack_ffffffffffffff70._M_current,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                     in_stack_ffffffffffffff68._M_current);
  if (bVar1) {
    do {
      bVar1 = __gnu_cxx::operator<
                        ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)in_stack_ffffffffffffff70._M_current,
                         (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)in_stack_ffffffffffffff68._M_current);
      local_79 = 0;
      if (bVar1) {
        p_Var3 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator--(&local_40);
        pdVar2 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(p_Var3);
        bVar1 = std::less<double>::operator()(&local_21,pdVar2,(double *)&local_30);
        local_79 = bVar1 ^ 0xff;
      }
    } while ((local_79 & 1) != 0);
  }
  else {
    do {
      p_Var3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator--(&local_40);
      pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(p_Var3);
      bVar1 = std::less<double>::operator()(&local_21,pdVar2,(double *)&local_30);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
  }
  local_49 = __gnu_cxx::operator>=
                       ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                         *)in_stack_ffffffffffffff70._M_current,
                        (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                         *)in_stack_ffffffffffffff68._M_current);
  while (bVar1 = __gnu_cxx::operator<
                           ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)in_stack_ffffffffffffff70._M_current,
                            (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)in_stack_ffffffffffffff68._M_current), bVar1) {
    local_58 = local_38._M_current;
    local_60 = local_40._M_current;
    std::
    iter_swap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    do {
      p_Var3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator++(&local_38);
      pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(p_Var3);
      bVar1 = std::less<double>::operator()(&local_21,pdVar2,(double *)&local_30);
    } while (bVar1);
    do {
      p_Var3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator--(&local_40);
      pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(p_Var3);
      bVar1 = std::less<double>::operator()(&local_21,pdVar2,(double *)&local_30);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
  }
  local_68 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator-(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70._M_current);
  p_Var3 = &local_68;
  pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator*(p_Var3);
  __y = (bool *)*pdVar2;
  pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator*(local_18);
  *pdVar2 = (double)__y;
  __x = local_30;
  pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator*(p_Var3);
  *pdVar2 = (double)__x;
  pVar4 = std::
          make_pair<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>&,bool&>
                    (__x,__y);
  return pVar4;
}

Assistant:

inline std::pair<Iter, bool> partition_right(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        
        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));

        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        
        // Keep swapping pairs of elements that are on the wrong side of the pivot. Previously
        // swapped pairs guard the searches, which is why the first iteration is special-cased
        // above.
        while (first < last) {
            std::iter_swap(first, last);
            while (comp(*++first, pivot));
            while (!comp(*--last, pivot));
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }